

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

int __thiscall
kj::anon_unknown_9::DiskFile::copy(DiskFile *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  EVP_PKEY_CTX *pEVar1;
  char cVar2;
  uint __fd;
  int iVar3;
  ulong uVar4;
  Exception *pEVar5;
  __off64_t _Var6;
  ssize_t sVar7;
  size_t __n;
  int iVar8;
  Exception *in_RCX;
  stat *__buf;
  stat *__buf_00;
  uint64_t size;
  ulong uVar9;
  ulong in_R8;
  size_t __nbytes;
  DiskHandle *this_00;
  Exception *pEVar10;
  bool bVar11;
  file_clone_range range;
  Fault f_2;
  byte buffer [4096];
  Exception *local_10d0;
  long local_10c8;
  Exception *local_10c0;
  EVP_PKEY_CTX *local_10b0;
  Fault local_10a8;
  undefined8 uStack_10a0;
  ulong local_1098;
  EVP_PKEY_CTX *pEStack_1090;
  EVP_PKEY_CTX *local_1080;
  ulong local_1078;
  Fault local_1070;
  ulong local_1068;
  EVP_PKEY_CTX *local_1060;
  ulong local_1058;
  DiskFile *local_1050;
  DiskHandle *local_1048;
  EVP_PKEY_CTX *local_1040;
  Fault local_1038;
  ulong uStack_1030;
  
  local_1080 = dst;
  local_1068 = in_R8;
  local_1060 = src;
  local_1050 = this;
  (*(code *)**(undefined8 **)src)(&local_1038,src);
  cVar2 = (char)local_1038.exception;
  if ((char)local_1038.exception != '\x01') goto LAB_001f86be;
  this_00 = &local_1050->super_DiskHandle;
  __fd = local_1038.exception._4_4_;
  uVar9 = local_1068;
  if ((local_1068 == 0xffffffffffffffff &&
       (in_RCX == (Exception *)0x0 && local_1080 == (EVP_PKEY_CTX *)0x0)) &&
     (DiskHandle::stat((DiskHandle *)&local_1038,(char *)this_00,__buf), uVar9 = local_1068,
     uStack_1030 == 0)) {
    iVar3 = ioctl((this_00->fd).fd,0x40049409,(ulong)__fd);
    if (iVar3 < 0) {
LAB_001f81c3:
      local_10c0 = (Exception *)0x7fffffffffffffff;
      if (local_1068 != 0xffffffffffffffff) {
        local_10c0 = (Exception *)((long)in_RCX->trace + (local_1068 - 0x68));
      }
      local_10b0 = local_1080;
      local_10d0 = in_RCX;
      local_1048 = this_00;
LAB_001f81ff:
      do {
        pEVar5 = (Exception *)lseek64(__fd,(__off64_t)local_10d0,4);
        if ((long)pEVar5 < 0) {
          iVar3 = _::Debug::getOsErrorNumber(false);
          if (iVar3 == -1) goto LAB_001f81ff;
        }
        else {
          iVar3 = 0;
        }
        bVar11 = true;
        pEVar10 = pEVar5;
        if ((iVar3 != 0) && (pEVar10 = local_10c0, iVar3 != 0x16)) {
          if (iVar3 != 6) {
            local_10a8.exception = (Exception *)0x0;
            local_1038.exception = (Exception *)0x0;
            uStack_1030 = 0;
            _::Debug::Fault::init
                      (&local_10a8,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                      );
            _::Debug::Fault::~Fault(&local_10a8);
          }
          local_10c8 = (long)local_10d0 - (long)in_RCX;
          bVar11 = false;
          pEVar10 = pEVar5;
        }
        if (bVar11) {
          if ((long)local_10c0 < (long)pEVar10) {
            pEVar10 = local_10c0;
          }
          local_1058 = (long)pEVar10 - (long)local_10d0;
          if (local_1058 != 0) {
            do {
              iVar3 = 0;
              _Var6 = lseek64((this_00->fd).fd,(__off64_t)local_10b0,0);
              if (-1 < _Var6) break;
              iVar3 = _::Debug::getOsErrorNumber(false);
            } while (iVar3 == -1);
            if (iVar3 != 0) {
              local_10a8.exception = (Exception *)0x0;
              local_1038.exception = (Exception *)0x0;
              uStack_1030 = 0;
              _::Debug::Fault::init
                        (&local_10a8,
                         (EVP_PKEY_CTX *)
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                        );
              _::Debug::Fault::fatal(&local_10a8);
            }
            local_10a8.exception = local_10d0;
            do {
              if ((long)pEVar10 <= (long)local_10a8.exception) goto LAB_001f83fb;
              do {
                sVar7 = sendfile64((this_00->fd).fd,__fd,(__off64_t *)&local_10a8,
                                   (long)pEVar10 - (long)local_10a8.exception);
                if (-1 < sVar7) {
                  iVar3 = 0;
                  break;
                }
                iVar3 = _::Debug::getOsErrorNumber(false);
              } while (iVar3 == -1);
              bVar11 = false;
              if (iVar3 == 0) {
                bVar11 = true;
                iVar8 = 0;
              }
              else {
                iVar8 = 8;
                if ((iVar3 != 0x16) && (bVar11 = false, iVar3 != 0x26)) {
                  local_1070.exception = (Exception *)0x0;
                  local_1038.exception = (Exception *)0x0;
                  uStack_1030 = 0;
                  _::Debug::Fault::init
                            (&local_1070,
                             (EVP_PKEY_CTX *)
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                            );
                  local_1078 = (long)local_10a8.exception - (long)local_10d0;
                  _::Debug::Fault::~Fault(&local_1070);
                  iVar8 = 1;
                  bVar11 = false;
                }
              }
              iVar3 = 0;
              if (sVar7 == 0) {
                iVar3 = 6;
              }
              if (!bVar11) {
                iVar3 = iVar8;
              }
            } while (iVar3 == 0);
            if (iVar3 == 6) {
LAB_001f83fb:
              local_1078 = (long)local_10a8.exception - (long)local_10d0;
              bVar11 = true;
            }
            else {
              bVar11 = iVar3 == 1;
            }
            if (!bVar11) {
              local_1040 = local_10b0;
              local_1078 = 0;
              pEVar5 = local_10d0;
              for (uVar9 = local_1058; uVar9 != 0; uVar9 = uVar9 - __n) {
                memset(&local_1038,0,0x1000);
                __nbytes = 0x1000;
                if (uVar9 < 0x1000) {
                  __nbytes = uVar9;
                }
                do {
                  __n = pread64(__fd,&local_1038,__nbytes,(__off64_t)pEVar5);
                  if (-1 < (long)__n) {
                    iVar3 = 0;
                    break;
                  }
                  iVar3 = _::Debug::getOsErrorNumber(false);
                } while (iVar3 == -1);
                pEVar1 = local_1040;
                this_00 = local_1048;
                if (iVar3 != 0) {
                  local_1070.exception = (Exception *)0x0;
                  local_10a8.exception = (Exception *)0x0;
                  uStack_10a0 = 0;
                  _::Debug::Fault::init
                            (&local_1070,
                             (EVP_PKEY_CTX *)
                             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                            );
                  _::Debug::Fault::fatal(&local_1070);
                }
                if (__n == 0) break;
                DiskHandle::write(local_1048,(int)local_1040,&local_1038,__n);
                pEVar5 = (Exception *)((long)pEVar5->trace + (__n - 0x68));
                local_1040 = pEVar1 + __n;
                local_1078 = local_1078 + __n;
              }
            }
            local_10d0 = (Exception *)((long)local_10d0->trace + (local_1078 - 0x68));
            local_10b0 = local_10b0 + local_1078;
            if (local_1078 < local_1058) {
              local_10c8 = (long)local_10d0 - (long)in_RCX;
              goto LAB_001f8520;
            }
          }
          bVar11 = local_10d0 != local_10c0;
          if (!bVar11) {
            local_10c8 = (long)local_10d0 - (long)in_RCX;
          }
        }
        else {
LAB_001f8520:
          bVar11 = false;
        }
        if (!bVar11) break;
        do {
          pEVar5 = (Exception *)lseek64(__fd,(__off64_t)local_10d0,3);
          if (-1 < (long)pEVar5) {
            iVar3 = 0;
            break;
          }
          iVar3 = _::Debug::getOsErrorNumber(false);
        } while (iVar3 == -1);
        bVar11 = true;
        if (iVar3 != 0) {
          if (iVar3 == 6) {
            do {
              iVar3 = 0;
              pEVar5 = (Exception *)lseek64(__fd,0,2);
              if (-1 < (long)pEVar5) break;
              iVar3 = _::Debug::getOsErrorNumber(false);
            } while (iVar3 == -1);
            if (iVar3 != 0) {
              local_10a8.exception = (Exception *)0x0;
              local_1038.exception = (Exception *)0x0;
              uStack_1030 = 0;
              _::Debug::Fault::init
                        (&local_10a8,
                         (EVP_PKEY_CTX *)
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                        );
              _::Debug::Fault::fatal(&local_10a8);
            }
            this_00 = local_1048;
            if ((long)local_10c0 < (long)pEVar5) {
              local_10c0 = pEVar5;
            }
          }
          else {
            if (iVar3 == 0x16) {
              _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                        (&local_1038,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                         ,0x27b,FAILED,(char *)0x0,
                         "\"can\'t determine hole size; SEEK_DATA not supported\"",
                         (char (*) [51])"can\'t determine hole size; SEEK_DATA not supported");
              _::Debug::Fault::fatal(&local_1038);
            }
            local_10a8.exception = (Exception *)0x0;
            local_1038.exception = (Exception *)0x0;
            uStack_1030 = 0;
            _::Debug::Fault::init
                      (&local_10a8,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                      );
            local_10c8 = (long)local_10d0 - (long)in_RCX;
            _::Debug::Fault::~Fault(&local_10a8);
            bVar11 = false;
          }
        }
        if (bVar11) {
          if ((long)local_10c0 < (long)pEVar5) {
            pEVar5 = local_10c0;
          }
          size = (long)pEVar5 - (long)local_10d0;
          if (size != 0 && (long)local_10d0 <= (long)pEVar5) {
            DiskHandle::zero(this_00,(uint64_t)local_10b0,size);
            local_10b0 = local_10b0 + size;
            local_10d0 = pEVar5;
          }
          bVar11 = local_10d0 != local_10c0;
          if (!bVar11) {
            local_10c8 = (long)local_10d0 - (long)in_RCX;
          }
        }
        else {
          bVar11 = false;
        }
      } while (bVar11);
      goto LAB_001f86be;
    }
    DiskHandle::stat((DiskHandle *)&local_1038,(char *)this_00,__buf_00);
    uVar4 = uStack_1030;
  }
  else {
    if (uVar9 == 0) {
      local_10c8._0_4_ = 0;
      goto LAB_001f86be;
    }
    local_10a8.exception = (Exception *)(long)(int)__fd;
    pEStack_1090 = local_1080;
    local_1098 = 0;
    if (uVar9 != 0xffffffffffffffff) {
      local_1098 = uVar9;
    }
    iVar3 = ioctl((this_00->fd).fd,0x4020940d);
    local_1068 = uVar9;
    if (iVar3 < 0) goto LAB_001f81c3;
    (**(code **)(*(long *)local_1060 + 0x10))(&local_1038);
    uVar4 = uStack_1030 - (long)in_RCX;
    if (uVar9 <= uStack_1030 - (long)in_RCX) {
      uVar4 = uVar9;
    }
  }
  local_10c8._0_4_ = (int)uVar4;
LAB_001f86be:
  if (cVar2 == '\0') {
    local_10c8._0_4_ = File::copy(&local_1050->super_File,local_1080,local_1060);
  }
  return (int)local_10c8;
}

Assistant:

size_t copy(uint64_t offset, const ReadableFile& from,
              uint64_t fromOffset, uint64_t size) const override {
    KJ_IF_SOME(result, DiskHandle::copy(offset, from, fromOffset, size)) {
      return result;
    } else {
      return File::copy(offset, from, fromOffset, size);
    }